

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O1

boolean read_text_integer(FILE *file,long *result,int *termchar)

{
  int iVar1;
  ushort **ppuVar2;
  boolean bVar3;
  long lVar4;
  
  bVar3 = 0;
  do {
    iVar1 = text_getc(file);
    if (iVar1 == -1) {
      iVar1 = -1;
      goto LAB_00107247;
    }
    ppuVar2 = __ctype_b_loc();
  } while (((*ppuVar2)[iVar1] >> 0xd & 1) != 0);
  bVar3 = 0;
  if (((*ppuVar2)[iVar1] >> 0xb & 1) != 0) {
    lVar4 = (long)(iVar1 + -0x30);
    while( true ) {
      iVar1 = text_getc(file);
      if ((iVar1 == -1) || ((*(byte *)((long)*ppuVar2 + (long)iVar1 * 2 + 1) & 8) == 0)) break;
      lVar4 = (long)iVar1 + lVar4 * 10 + -0x30;
    }
    *result = lVar4;
    bVar3 = 1;
  }
LAB_00107247:
  *termchar = iVar1;
  return bVar3;
}

Assistant:

LOCAL(boolean)
read_text_integer(FILE *file, long *result, int *termchar)
/* Read an unsigned decimal integer from a file, store it in result */
/* Reads one trailing character after the integer; returns it in termchar */
{
  register int ch;
  register long val;

  /* Skip any leading whitespace, detect EOF */
  do {
    ch = text_getc(file);
    if (ch == EOF) {
      *termchar = ch;
      return FALSE;
    }
  } while (isspace(ch));

  if (!isdigit(ch)) {
    *termchar = ch;
    return FALSE;
  }

  val = ch - '0';
  while ((ch = text_getc(file)) != EOF) {
    if (!isdigit(ch))
      break;
    val *= 10;
    val += ch - '0';
  }
  *result = val;
  *termchar = ch;
  return TRUE;
}